

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
InvalidateFixedField<Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> *this,
          PropertyRecord *propertyKey,SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor
          ,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId_00;
  undefined4 *puVar3;
  ThreadContext *this_00;
  PropertyId propertyId;
  ScriptContext *scriptContext_local;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor_local;
  PropertyRecord *propertyKey_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this_local;
  
  if ((*(byte *)descriptor >> 1 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xc89,"(descriptor->isInitialized)","descriptor->isInitialized");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *(byte *)descriptor = *(byte *)descriptor & 0xfb;
  if ((*(byte *)descriptor >> 3 & 1) != 0) {
    propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyKey);
    this_00 = ScriptContext::GetThreadContext(scriptContext);
    ThreadContext::InvalidatePropertyGuards(this_00,propertyId_00);
    *(byte *)descriptor = *(byte *)descriptor & 0xf7;
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::InvalidateFixedField(const TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, ScriptContext* scriptContext)
    {
        Assert(descriptor->isInitialized);

        descriptor->isFixed = false;

        if (descriptor->usedAsFixed)
        {
#if ENABLE_NATIVE_CODEGEN
            PropertyId propertyId = TMapKey_GetPropertyId(scriptContext, propertyKey);
            scriptContext->GetThreadContext()->InvalidatePropertyGuards(propertyId);
#endif
            descriptor->usedAsFixed = false;
        }
    }